

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-x509.c
# Opt level: O2

int lws_tls_vhost_cert_info
              (lws_vhost *vhost,lws_tls_cert_info type,lws_tls_cert_info_results *buf,size_t len)

{
  X509 *x509;
  int iVar1;
  
  x509 = (X509 *)SSL_CTX_get0_certificate((vhost->tls).ssl_ctx);
  iVar1 = lws_tls_openssl_cert_info(x509,type,buf,len);
  return iVar1;
}

Assistant:

int
lws_tls_vhost_cert_info(struct lws_vhost *vhost, enum lws_tls_cert_info type,
		        union lws_tls_cert_info_results *buf, size_t len)
{
#if defined(LWS_HAVE_SSL_CTX_get0_certificate)
	X509 *x509 = SSL_CTX_get0_certificate(vhost->tls.ssl_ctx);

	return lws_tls_openssl_cert_info(x509, type, buf, len);
#else
	lwsl_notice("openssl is too old to support %s\n", __func__);

	return -1;
#endif
}